

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_power_unk44(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power_unk44 *peVar1;
  envy_bios_power_unk44 *unk44;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->power).unk44;
  if ((peVar1->offset != 0) && ((mask & 0x400) != 0)) {
    if ((bios->power).unk44.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse PERF TEST SPEC table at 0x%x, version %x\n",
              (ulong)peVar1->offset,(ulong)(bios->power).unk44.version);
    }
    else {
      fprintf((FILE *)out,"PERF TEST SPEC table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->power).unk44.version);
      envy_bios_dump_hex(bios,out,peVar1->offset,(uint)(bios->power).unk44.hlen,mask);
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_power_unk44(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk44 *unk44 = &bios->power.unk44;

	if (!unk44->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!unk44->valid) {
		fprintf(out, "Failed to parse PERF TEST SPEC table at 0x%x, version %x\n", unk44->offset, unk44->version);
		return;
	}

	fprintf(out, "PERF TEST SPEC table at 0x%x, version %x\n", unk44->offset, unk44->version);
	envy_bios_dump_hex(bios, out, unk44->offset, unk44->hlen, mask);
	fprintf(out, "\n");
}